

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encapsulated_vectorization.cpp
# Opt level: O2

Vector4d * operator+(Vector4d *v1,Vector4d *v2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Vector4d *in_RDI;
  
  dVar1 = v1->data[1];
  dVar2 = v1->data[2];
  dVar3 = v1->data[3];
  dVar4 = v2->data[1];
  dVar5 = v2->data[2];
  dVar6 = v2->data[3];
  in_RDI->data[0] = v1->data[0] + v2->data[0];
  in_RDI->data[1] = dVar1 + dVar4;
  in_RDI->data[2] = dVar2 + dVar5;
  in_RDI->data[3] = dVar3 + dVar6;
  return in_RDI;
}

Assistant:

Vector4d operator+ (const Vector4d& v1, const Vector4d& v2) {
  __m256d data1 = _mm256_load_pd(v1.data);
  __m256d data2 = _mm256_load_pd(v2.data);
  __m256d data3 = _mm256_add_pd(data1, data2);
  Vector4d result;
  _mm256_store_pd(result.data, data3);
  return result;
}